

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O0

string * __thiscall CEObserver::print_abi_cxx11_(CEObserver *this)

{
  CEObserver *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [54];
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"Observer:\n",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Longitude_Deg(in_RSI);
  std::__cxx11::to_string((double)in_stack_fffffffffffffce8);
  std::operator+((char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  Latitude_Deg(in_RSI);
  std::__cxx11::to_string((double)in_stack_fffffffffffffce8);
  std::operator+(__lhs,pbVar1);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  std::__cxx11::string::operator+=((string *)in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  Elevation_m(in_RSI);
  std::__cxx11::to_string((double)in_stack_fffffffffffffce8);
  std::operator+((char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  std::__cxx11::string::operator+=((string *)in_RDI,local_108);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  Temperature_C(in_RSI);
  std::__cxx11::to_string((double)in_stack_fffffffffffffce8);
  std::operator+((char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  std::__cxx11::string::operator+=((string *)in_RDI,local_168);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_1a8);
  Pressure_hPa(in_RSI);
  std::__cxx11::to_string((double)in_stack_fffffffffffffce8);
  std::operator+((char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  std::__cxx11::string::operator+=((string *)in_RDI,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_208);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           RelativeHumidity(in_RSI);
  std::__cxx11::to_string((double)pbVar1);
  std::operator+((char *)pbVar1,in_stack_fffffffffffffce0);
  std::operator+(pbVar1,(char *)in_stack_fffffffffffffce0);
  std::__cxx11::string::operator+=((string *)in_RDI,local_228);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_268);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Wavelength_um(in_RSI)
  ;
  std::__cxx11::to_string((double)pbVar1);
  std::operator+((char *)pbVar1,__rhs);
  std::operator+(pbVar1,(char *)__rhs);
  std::__cxx11::string::operator+=((string *)in_RDI,local_288);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_2c8);
  return __lhs;
}

Assistant:

std::string CEObserver::print(void) const
{
    // Fill in the returned string with formatted strings
    std::string msg("Observer:\n");
    msg += "   (Lon,Lat) = (" + std::to_string(Longitude_Deg()) + ", "  + 
                                std::to_string(Latitude_Deg()) + ") deg\n";
    msg += "   Elevation = " + std::to_string(Elevation_m()) + " m\n";
    msg += "   Temp      = " + std::to_string(Temperature_C()) + " C\n";
    msg += "   Pressure  = " + std::to_string(Pressure_hPa()) + " hPa\n";
    msg += "   Humidity  = " + std::to_string(RelativeHumidity()) + " %%\n";
    msg += "   Wavelength= " + std::to_string(Wavelength_um()) + " um\n";
    return msg;
}